

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O1

vector<WorldPath_*,_std::allocator<WorldPath_*>_> * __thiscall
WorldShuffler::build_weighted_blocked_paths_list
          (vector<WorldPath_*,_std::allocator<WorldPath_*>_> *__return_storage_ptr__,
          WorldShuffler *this)

{
  undefined1 uVar1;
  Item *pIVar2;
  pointer pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  void *pvVar5;
  pointer ppIVar6;
  void *pvVar7;
  mapped_type_conflict2 *pmVar8;
  _Base_ptr p_Var9;
  Json *this_00;
  reference this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  _Rb_tree_node_base *p_Var11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  _Rb_tree_node_base *p_Var13;
  uint uVar14;
  pointer ppWVar15;
  pointer ppWVar16;
  pointer ppIVar17;
  bool bVar18;
  WorldPath *path;
  vector<WorldPath_*,_std::allocator<WorldPath_*>_> weighted_blocked_paths;
  vector<Item_*,_std::allocator<Item_*>_> items_to_place;
  map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
  quantities_to_place;
  WorldPath *local_108;
  WorldSolver *local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  vector<WorldPath_*,_std::allocator<WorldPath_*>_> local_d8;
  WorldShuffler *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  vector<Item_*,_std::allocator<Item_*>_> local_90;
  void *local_78;
  _Rb_tree_node_base local_70;
  size_t local_50;
  vector<WorldPath_*,_std::allocator<WorldPath_*>_> *local_48;
  pointer local_40;
  map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
  *local_38;
  
  local_d8.super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppWVar16 = (this->_solver)._blocked_paths.
             super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppWVar15 = (this->_solver)._blocked_paths.
             super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_b8 = this;
  local_48 = __return_storage_ptr__;
  if (ppWVar16 != ppWVar15) {
    local_100 = &this->_solver;
    local_38 = &this->_item_pool_quantities;
    local_40 = ppWVar15;
    do {
      local_108 = *ppWVar16;
      WorldSolver::missing_nodes_to_take_path
                ((vector<WorldNode_*,_std::allocator<WorldNode_*>_> *)&local_78,local_100,local_108)
      ;
      pvVar7 = local_78;
      pvVar5 = (void *)CONCAT44(local_70._4_4_,local_70._M_color);
      if (local_78 != (void *)0x0) {
        operator_delete(local_78,(long)local_70._M_parent - (long)local_78);
      }
      if (pvVar7 == pvVar5) {
        WorldSolver::missing_items_to_take_path(&local_90,local_100,local_108);
        ppIVar6 = local_90.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        local_70._M_color = _S_red;
        local_70._M_parent = (_Rb_tree_node_base *)0x0;
        local_50 = 0;
        local_70._M_left = &local_70;
        local_70._M_right = &local_70;
        for (ppIVar17 = local_90.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                        super__Vector_impl_data._M_start; ppWVar15 = local_40, ppIVar17 != ppIVar6;
            ppIVar17 = ppIVar17 + 1) {
          pIVar2 = *ppIVar17;
          uVar1 = pIVar2->_id;
          p_Var11 = &local_70;
          for (p_Var9 = local_70._M_parent; p_Var9 != (_Rb_tree_node_base *)0x0;
              p_Var9 = (&p_Var9->_M_left)[bVar18]) {
            bVar18 = (byte)(char)p_Var9[1]._M_color < (byte)uVar1;
            if (!bVar18) {
              p_Var11 = p_Var9;
            }
          }
          p_Var13 = &local_70;
          if ((p_Var11 != &local_70) &&
             (p_Var13 = p_Var11, (byte)uVar1 < (byte)(char)p_Var11[1]._M_color)) {
            p_Var13 = &local_70;
          }
          if (p_Var13 == &local_70) {
            local_f8._M_dataplus._M_p._0_1_ = uVar1;
            pmVar8 = std::
                     map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
                     ::operator[]((map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
                                   *)&local_78,(key_type_conflict *)&local_f8);
            *pmVar8 = 0;
          }
          local_f8._M_dataplus._M_p._0_1_ = pIVar2->_id;
          pmVar8 = std::
                   map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
                   ::operator[]((map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
                                 *)&local_78,(key_type_conflict *)&local_f8);
          *pmVar8 = *pmVar8 + 1;
        }
        if (local_70._M_left == &local_70) {
LAB_0019896b:
          if (local_108->_weight != 0) {
            uVar14 = 0;
            do {
              std::vector<WorldPath*,std::allocator<WorldPath*>>::emplace_back<WorldPath*&>
                        ((vector<WorldPath*,std::allocator<WorldPath*>> *)&local_d8,&local_108);
              uVar14 = uVar14 + 1;
            } while (uVar14 < local_108->_weight);
          }
          this_00 = WorldSolver::debug_log_for_current_step_abi_cxx11_(local_100);
          this_01 = nlohmann::
                    basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ::operator[]<char_const>
                              ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                *)this_00,"blockedPaths");
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          pcVar3 = (local_108->_from_node->_id)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,pcVar3,
                     pcVar3 + (local_108->_from_node->_id)._M_string_length);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&local_b0," --> ");
          pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::_M_append(&local_b0,(local_108->_to_node->_id)._M_dataplus._M_p,
                                (local_108->_to_node->_id)._M_string_length);
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pbVar10->_M_dataplus)._M_p;
          paVar12 = &pbVar10->field_2;
          if (paVar4 == paVar12) {
            local_f8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
          }
          else {
            local_f8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_f8._M_dataplus._M_p = (pointer)paVar4;
          }
          local_f8._M_string_length = pbVar10->_M_string_length;
          (pbVar10->_M_dataplus)._M_p = (pointer)paVar12;
          pbVar10->_M_string_length = 0;
          (pbVar10->field_2)._M_local_buf[0] = '\0';
          nlohmann::
          basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::emplace_back<std::__cxx11::string>
                    ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)this_01,&local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          bVar18 = true;
          p_Var9 = local_70._M_left;
          do {
            pmVar8 = std::
                     map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
                     ::operator[](local_38,(key_type_conflict *)(p_Var9 + 1));
            if (*pmVar8 < (ushort)*(undefined2 *)((long)&p_Var9[1]._M_color + 2)) {
              bVar18 = false;
              break;
            }
            p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
          } while (p_Var9 != &local_70);
          if (bVar18) goto LAB_0019896b;
        }
        std::
        _Rb_tree<unsigned_char,_std::pair<const_unsigned_char,_unsigned_short>,_std::_Select1st<std::pair<const_unsigned_char,_unsigned_short>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
        ::~_Rb_tree((_Rb_tree<unsigned_char,_std::pair<const_unsigned_char,_unsigned_short>,_std::_Select1st<std::pair<const_unsigned_char,_unsigned_short>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
                     *)&local_78);
        if (local_90.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_90.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_90.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_90.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
      }
      ppWVar16 = ppWVar16 + 1;
    } while (ppWVar16 != ppWVar15);
  }
  vectools::shuffle<WorldPath*>(&local_d8,&local_b8->_rng);
  (local_48->super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>)._M_impl.
  super__Vector_impl_data._M_start =
       local_d8.super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  (local_48->super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>)._M_impl.
  super__Vector_impl_data._M_finish =
       local_d8.super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (local_48->super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_d8.super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  return local_48;
}

Assistant:

std::vector<WorldPath*> WorldShuffler::build_weighted_blocked_paths_list()
{
    const std::vector<WorldPath*>& blocked_paths = _solver.blocked_paths();
    std::vector<WorldPath*> weighted_blocked_paths;

    for (WorldPath* path : blocked_paths)
    {
        // If items are not the (only) blocking point for taking this path, let it go
        if(!_solver.missing_nodes_to_take_path(path).empty())
            continue;

        // If all items cannot be placed since the item pool is running out of that item type,
        // do not try to open this path. It will open by itself once the item (as placed inside plando)
        // will be reached.
        std::vector<Item*> items_to_place = _solver.missing_items_to_take_path(path);
        std::map<uint8_t, uint16_t> quantities_to_place;
        for(Item* item : items_to_place)
        {
            if(!quantities_to_place.count(item->id()))
                quantities_to_place[item->id()] = 0;
            quantities_to_place[item->id()] += 1;
        }

        bool can_place_all_items = true;
        for(auto& [item_id, quantity_to_place] : quantities_to_place)
        {
            if(_item_pool_quantities[item_id] < quantity_to_place)
            {
                can_place_all_items = false;
                break;
            }
        }

        if(can_place_all_items)
        {
            for(int i=0 ; i<path->weight() ; ++i)
                weighted_blocked_paths.emplace_back(path);

            // All conditions are met, add this path to the weighted blocked paths list
            Json& debug_log = _solver.debug_log_for_current_step();
            debug_log["blockedPaths"].emplace_back(path->origin()->id() + " --> " + path->destination()->id());
        }
    }

    vectools::shuffle(weighted_blocked_paths, _rng);
    return std::move(weighted_blocked_paths);
}